

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootchart.c
# Opt level: O3

void bootchart_finish(void)

{
  unlink("/var/log/bootchart-stop");
  if (0 < log_stat[0].count) {
    unix_write(log_stat[0].fd,log_stat[0].data,log_stat[0].count);
    log_stat[0].count = 0;
  }
  if (0 < log_disks[0].count) {
    unix_write(log_disks[0].fd,log_disks[0].data,log_disks[0].count);
    log_disks[0].count = 0;
  }
  if (0 < log_procs[0].count) {
    unix_write(log_procs[0].fd,log_procs[0].data,log_procs[0].count);
    log_procs[0].count = 0;
  }
  acct((char *)0x0);
  return;
}

Assistant:

void  bootchart_finish( void )
{
    unlink( LOG_STOPFILE );
    file_buff_done(log_stat);
    file_buff_done(log_disks);
    file_buff_done(log_procs);
    acct(NULL);
}